

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdtd-imp.h
# Opt level: O0

int hd_drop_imp(hd_context *ctx,void *p,int *refs)

{
  int iVar1;
  undefined4 local_2c;
  int drop;
  int *refs_local;
  void *p_local;
  hd_context *ctx_local;
  
  if (p == (void *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    if (*refs < 1) {
      local_2c = 0;
    }
    else {
      iVar1 = *refs;
      *refs = iVar1 + -1;
      local_2c = (uint)(iVar1 + -1 == 0);
    }
    ctx_local._4_4_ = local_2c;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int
hd_drop_imp(hd_context *ctx, void *p, int *refs)
{
    if (p)
    {
        int drop;
        if (*refs > 0)
            (void)Memento_dropRef(p);
        if (*refs > 0)
            drop = --*refs == 0;
        else
            drop = 0;
        return drop;
    }
    return 0;
}